

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O2

void finish(sender *s)

{
  v_array<int>::delete_v(&s->buf->files);
  v_array<char>::delete_v(&s->buf->space);
  free(s->delay_ring);
  if (s->buf != (io_buf *)0x0) {
    (*s->buf->_vptr_io_buf[3])();
    return;
  }
  return;
}

Assistant:

void finish(sender& s)
{
  s.buf->files.delete_v();
  s.buf->space.delete_v();
  free(s.delay_ring);
  delete s.buf;
}